

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrs.cpp
# Opt level: O0

UBool __thiscall
icu_63::NFRuleSet::parse
          (NFRuleSet *this,UnicodeString *text,ParsePosition *pos,double upperBound,
          uint32_t nonNumericalExecutedRuleMask,Formattable *result)

{
  bool bVar1;
  UBool UVar2;
  int32_t iVar3;
  int32_t iVar4;
  int64_t iVar5;
  NFRule *pNVar6;
  int64_t iVar7;
  undefined1 local_168 [7];
  UBool success_1;
  Formattable tempResult_1;
  int32_t i_1;
  int64_t ub;
  undefined1 local_e0 [7];
  UBool success;
  Formattable tempResult;
  int i;
  undefined1 local_60 [8];
  ParsePosition workingPos;
  ParsePosition highWaterMark;
  Formattable *result_local;
  uint32_t nonNumericalExecutedRuleMask_local;
  double upperBound_local;
  ParsePosition *pos_local;
  UnicodeString *text_local;
  NFRuleSet *this_local;
  
  Formattable::setLong(result,0);
  iVar3 = UnicodeString::length(text);
  if (iVar3 == 0) {
    this_local._7_1_ = '\0';
  }
  else {
    ParsePosition::ParsePosition((ParsePosition *)&workingPos.index);
    ParsePosition::ParsePosition((ParsePosition *)local_60,pos);
    result_local._4_4_ = nonNumericalExecutedRuleMask;
    for (tempResult.fBogus.fUnion._48_4_ = 0; (int)tempResult.fBogus.fUnion._48_4_ < 6;
        tempResult.fBogus.fUnion._48_4_ = tempResult.fBogus.fUnion._48_4_ + 1) {
      if ((this->nonNumericalRules[(int)tempResult.fBogus.fUnion._48_4_] != (NFRule *)0x0) &&
         ((result_local._4_4_ >> ((byte)tempResult.fBogus.fUnion._48_4_ & 0x1f) & 1) == 0)) {
        result_local._4_4_ = result_local._4_4_ | 1 << (tempResult.fBogus.fUnion._48_4_ & 0x1f);
        Formattable::Formattable((Formattable *)local_e0);
        UVar2 = NFRule::doParse(this->nonNumericalRules[(int)tempResult.fBogus.fUnion._48_4_],text,
                                (ParsePosition *)local_60,'\0',upperBound,result_local._4_4_,
                                (Formattable *)local_e0);
        if (UVar2 != '\0') {
          iVar3 = ParsePosition::getIndex((ParsePosition *)local_60);
          iVar4 = ParsePosition::getIndex((ParsePosition *)&workingPos.index);
          if (iVar4 < iVar3) {
            Formattable::operator=(result,(Formattable *)local_e0);
            ParsePosition::operator=((ParsePosition *)&workingPos.index,(ParsePosition *)local_60);
          }
        }
        ParsePosition::operator=((ParsePosition *)local_60,pos);
        Formattable::~Formattable((Formattable *)local_e0);
      }
    }
    iVar5 = util64_fromDouble(upperBound);
    tempResult_1.fBogus.fUnion._52_4_ = NFRuleList::size(&this->rules);
LAB_002cd334:
    tempResult_1.fBogus.fUnion._52_4_ = tempResult_1.fBogus.fUnion._52_4_ + -1;
    bVar1 = false;
    if (-1 < (int)tempResult_1.fBogus.fUnion._52_4_) {
      iVar3 = ParsePosition::getIndex((ParsePosition *)&workingPos.index);
      iVar4 = UnicodeString::length(text);
      bVar1 = iVar3 < iVar4;
    }
    if (bVar1) {
      if (this->fIsFractionRuleSet == '\0') goto code_r0x002cd3a8;
      goto LAB_002cd3f1;
    }
    ParsePosition::operator=(pos,(ParsePosition *)&workingPos.index);
    this_local._7_1_ = '\x01';
    ParsePosition::~ParsePosition((ParsePosition *)local_60);
    ParsePosition::~ParsePosition((ParsePosition *)&workingPos.index);
  }
  return this_local._7_1_;
code_r0x002cd3a8:
  pNVar6 = NFRuleList::operator[](&this->rules,tempResult_1.fBogus.fUnion._52_4_);
  iVar7 = NFRule::getBaseValue(pNVar6);
  if (iVar7 < iVar5) {
LAB_002cd3f1:
    Formattable::Formattable((Formattable *)local_168);
    pNVar6 = NFRuleList::operator[](&this->rules,tempResult_1.fBogus.fUnion._52_4_);
    UVar2 = NFRule::doParse(pNVar6,text,(ParsePosition *)local_60,this->fIsFractionRuleSet,
                            upperBound,result_local._4_4_,(Formattable *)local_168);
    if (UVar2 != '\0') {
      iVar3 = ParsePosition::getIndex((ParsePosition *)local_60);
      iVar4 = ParsePosition::getIndex((ParsePosition *)&workingPos.index);
      if (iVar4 < iVar3) {
        Formattable::operator=(result,(Formattable *)local_168);
        ParsePosition::operator=((ParsePosition *)&workingPos.index,(ParsePosition *)local_60);
      }
    }
    ParsePosition::operator=((ParsePosition *)local_60,pos);
    Formattable::~Formattable((Formattable *)local_168);
  }
  goto LAB_002cd334;
}

Assistant:

UBool
NFRuleSet::parse(const UnicodeString& text, ParsePosition& pos, double upperBound, uint32_t nonNumericalExecutedRuleMask, Formattable& result) const
{
    // try matching each rule in the rule set against the text being
    // parsed.  Whichever one matches the most characters is the one
    // that determines the value we return.

    result.setLong(0);

    // dump out if there's no text to parse
    if (text.length() == 0) {
        return 0;
    }

    ParsePosition highWaterMark;
    ParsePosition workingPos = pos;

#ifdef RBNF_DEBUG
    fprintf(stderr, "<nfrs> %x '", this);
    dumpUS(stderr, name);
    fprintf(stderr, "' text '");
    dumpUS(stderr, text);
    fprintf(stderr, "'\n");
    fprintf(stderr, "  parse negative: %d\n", this, negativeNumberRule != 0);
#endif
    // Try each of the negative rules, fraction rules, infinity rules and NaN rules
    for (int i = 0; i < NON_NUMERICAL_RULE_LENGTH; i++) {
        if (nonNumericalRules[i] && ((nonNumericalExecutedRuleMask >> i) & 1) == 0) {
            // Mark this rule as being executed so that we don't try to execute it again.
            nonNumericalExecutedRuleMask |= 1 << i;

            Formattable tempResult;
            UBool success = nonNumericalRules[i]->doParse(text, workingPos, 0, upperBound, nonNumericalExecutedRuleMask, tempResult);
            if (success && (workingPos.getIndex() > highWaterMark.getIndex())) {
                result = tempResult;
                highWaterMark = workingPos;
            }
            workingPos = pos;
        }
    }
#ifdef RBNF_DEBUG
    fprintf(stderr, "<nfrs> continue other with text '");
    dumpUS(stderr, text);
    fprintf(stderr, "' hwm: %d\n", highWaterMark.getIndex());
#endif

    // finally, go through the regular rules one at a time.  We start
    // at the end of the list because we want to try matching the most
    // sigificant rule first (this helps ensure that we parse
    // "five thousand three hundred six" as
    // "(five thousand) (three hundred) (six)" rather than
    // "((five thousand three) hundred) (six)").  Skip rules whose
    // base values are higher than the upper bound (again, this helps
    // limit ambiguity by making sure the rules that match a rule's
    // are less significant than the rule containing the substitutions)/
    {
        int64_t ub = util64_fromDouble(upperBound);
#ifdef RBNF_DEBUG
        {
            char ubstr[64];
            util64_toa(ub, ubstr, 64);
            char ubstrhex[64];
            util64_toa(ub, ubstrhex, 64, 16);
            fprintf(stderr, "ub: %g, i64: %s (%s)\n", upperBound, ubstr, ubstrhex);
        }
#endif
        for (int32_t i = rules.size(); --i >= 0 && highWaterMark.getIndex() < text.length();) {
            if ((!fIsFractionRuleSet) && (rules[i]->getBaseValue() >= ub)) {
                continue;
            }
            Formattable tempResult;
            UBool success = rules[i]->doParse(text, workingPos, fIsFractionRuleSet, upperBound, nonNumericalExecutedRuleMask, tempResult);
            if (success && workingPos.getIndex() > highWaterMark.getIndex()) {
                result = tempResult;
                highWaterMark = workingPos;
            }
            workingPos = pos;
        }
    }
#ifdef RBNF_DEBUG
    fprintf(stderr, "<nfrs> exit\n");
#endif
    // finally, update the parse postion we were passed to point to the
    // first character we didn't use, and return the result that
    // corresponds to that string of characters
    pos = highWaterMark;

    return 1;
}